

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afmparse.c
# Opt level: O2

int afm_stream_skip_spaces(AFM_Stream stream)

{
  FT_Byte *pFVar1;
  FT_Byte FVar2;
  int in_EAX;
  int iVar3;
  FT_Byte *pFVar4;
  
  if (0 < stream->status) {
    return in_EAX;
  }
  iVar3 = 3;
  pFVar4 = stream->cursor;
  do {
    if (stream->limit <= pFVar4) goto LAB_001f44f1;
    pFVar1 = pFVar4 + 1;
    stream->cursor = pFVar1;
    FVar2 = *pFVar4;
    pFVar4 = pFVar1;
  } while ((FVar2 == '\t') || (FVar2 == ' '));
  if (FVar2 != '\n') {
    if (FVar2 == ';') {
      iVar3 = 1;
      goto LAB_001f44f1;
    }
    if (FVar2 == '\x1a') goto LAB_001f44f1;
    if (FVar2 != '\r') {
      return 3;
    }
  }
  iVar3 = 2;
LAB_001f44f1:
  stream->status = iVar3;
  return iVar3;
}

Assistant:

static int
  afm_stream_skip_spaces( AFM_Stream  stream )
  {
    int  ch = 0;  /* make stupid compiler happy */


    if ( AFM_STATUS_EOC( stream ) )
      return ';';

    while ( 1 )
    {
      ch = AFM_GETC();
      if ( !AFM_IS_SPACE( ch ) )
        break;
    }

    if ( AFM_IS_NEWLINE( ch ) )
      stream->status = AFM_STREAM_STATUS_EOL;
    else if ( AFM_IS_SEP( ch ) )
      stream->status = AFM_STREAM_STATUS_EOC;
    else if ( AFM_IS_EOF( ch ) )
      stream->status = AFM_STREAM_STATUS_EOF;

    return ch;
  }